

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

run_container_t * run_container_clone(run_container_t *src)

{
  int32_t iVar1;
  run_container_t *prVar2;
  
  prVar2 = run_container_create_given_capacity(src->capacity);
  if (prVar2 == (run_container_t *)0x0) {
    prVar2 = (run_container_t *)0x0;
  }
  else {
    iVar1 = src->capacity;
    prVar2->n_runs = src->n_runs;
    prVar2->capacity = iVar1;
    memcpy(prVar2->runs,src->runs,(long)src->n_runs << 2);
  }
  return prVar2;
}

Assistant:

ALLOW_UNALIGNED
run_container_t *run_container_clone(const run_container_t *src) {
    run_container_t *run = run_container_create_given_capacity(src->capacity);
    if (run == NULL) return NULL;
    run->capacity = src->capacity;
    run->n_runs = src->n_runs;
    memcpy(run->runs, src->runs, src->n_runs * sizeof(rle16_t));
    return run;
}